

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum_core.cpp
# Opt level: O2

void mbedtls_mpi_core_cond_swap
               (mbedtls_mpi_uint *X,mbedtls_mpi_uint *Y,size_t limbs,mbedtls_ct_condition_t swap)

{
  ulong uVar1;
  size_t i;
  size_t sVar2;
  
  if (X != Y) {
    for (sVar2 = 0; limbs != sVar2; sVar2 = sVar2 + 1) {
      uVar1 = X[sVar2];
      X[sVar2] = ~(mbedtls_ct_zero ^ swap) & uVar1 | Y[sVar2] & swap;
      Y[sVar2] = ~(mbedtls_ct_zero ^ swap) & Y[sVar2] | uVar1 & swap;
    }
  }
  return;
}

Assistant:

void mbedtls_mpi_core_cond_swap(mbedtls_mpi_uint *X,
                                mbedtls_mpi_uint *Y,
                                size_t limbs,
                                mbedtls_ct_condition_t swap)
{
    if (X == Y) {
        return;
    }

    for (size_t i = 0; i < limbs; i++) {
        mbedtls_mpi_uint tmp = X[i];
        X[i] = mbedtls_ct_mpi_uint_if(swap, Y[i], X[i]);
        Y[i] = mbedtls_ct_mpi_uint_if(swap, tmp, Y[i]);
    }
}